

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.c
# Opt level: O3

int checkbuffer(ZIO *z)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  if (z->n == 0) {
    iVar1 = luaZ_fill(z);
    if (iVar1 == -1) {
      iVar2 = 0;
    }
    else {
      z->n = z->n + 1;
      z->p = z->p + -1;
    }
  }
  return iVar2;
}

Assistant:

static int checkbuffer (ZIO *z) {
  if (z->n == 0) {  /* no bytes in buffer? */
    if (luaZ_fill(z) == EOZ)  /* try to read more */
      return 0;  /* no more input */
    else {
      z->n++;  /* luaZ_fill consumed first byte; put it back */
      z->p--;
    }
  }
  return 1;  /* now buffer has something */
}